

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O3

uint processorstart(logdir *ld)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  char *prog [4];
  
  if ((ld->processor).len == 0) {
    return 0;
  }
  if (ld->ppid != 0) {
    strerr_warn("svlogd: warning: ","processor already running",": ",ld->name,(char *)0x0,
                (char *)0x0,(strerr *)0x0);
    return 0;
  }
  while (_Var1 = fork(), _Var1 == -1) {
    strerr_warn("svlogd: pausing: ","unable to fork for processor",": ",ld->name,": ",(char *)0x0,
                &strerr_sys);
    sleep(3);
  }
  if (_Var1 != 0) goto LAB_001039ba;
  sig_catch(sig_term,sig_defaulthandler);
  sig_catch(sig_alarm,sig_defaulthandler);
  sig_catch(sig_hangup,sig_defaulthandler);
  sig_unblock(sig_term);
  sig_unblock(sig_alarm);
  sig_unblock(sig_hangup);
  if (verbose != 0) {
    strerr_warn("svlogd: info: ","processing: ",ld->name,"/",ld->fnsave,(char *)0x0,(strerr *)0x0);
  }
  iVar2 = open_read(ld->fnsave);
  if (iVar2 == -1) {
    strerr_die(0x6f,"svlogd: fatal: ","unable to open input for processor",": ",ld->name,": ",
               (char *)0x0,&strerr_sys);
  }
  iVar2 = fd_move(0,iVar2);
  if (iVar2 == -1) {
    strerr_die(0x6f,"svlogd: fatal: ","unable to move filedescriptor for processor",": ",ld->name,
               ": ",(char *)0x0,&strerr_sys);
  }
  ld->fnsave[0x1a] = 't';
  iVar2 = open_trunc(ld->fnsave);
  if (iVar2 == -1) {
    strerr_die(0x6f,"svlogd: fatal: ","unable to open output for processor",": ",ld->name,": ",
               (char *)0x0,&strerr_sys);
  }
  iVar2 = fd_move(1,iVar2);
  if (iVar2 == -1) {
    strerr_die(0x6f,"svlogd: fatal: ","unable to move filedescriptor for processor",": ",ld->name,
               ": ",(char *)0x0,&strerr_sys);
  }
  iVar2 = open_read("state");
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == error_noent) {
      iVar2 = open_trunc("state");
      if (iVar2 == -1) {
        strerr_die(0x6f,"svlogd: fatal: ","unable to create empty state for processor",": ",ld->name
                   ,": ",(char *)0x0,&strerr_sys);
      }
      close(iVar2);
      iVar2 = open_read("state");
      if (iVar2 != -1) goto LAB_0010387f;
    }
    strerr_die(0x6f,"svlogd: fatal: ","unable to open state for processor",": ",ld->name,": ",
               (char *)0x0,&strerr_sys);
    iVar2 = -1;
  }
LAB_0010387f:
  iVar2 = fd_move(4,iVar2);
  if (iVar2 == -1) {
    strerr_die(0x6f,"svlogd: fatal: ","unable to move filedescriptor for processor",": ",ld->name,
               ": ",(char *)0x0,&strerr_sys);
  }
  iVar2 = open_trunc("newstate");
  if (iVar2 == -1) {
    strerr_die(0x6f,"svlogd: fatal: ","unable to open newstate for processor",": ",ld->name,": ",
               (char *)0x0,&strerr_sys);
  }
  iVar2 = fd_move(5,iVar2);
  if (iVar2 == -1) {
    strerr_die(0x6f,"svlogd: fatal: ","unable to move filedescriptor for processor",": ",ld->name,
               ": ",(char *)0x0,&strerr_sys);
  }
  prog[0] = "sh";
  prog[1] = "-c";
  prog[2] = (ld->processor).s;
  prog[3] = (char *)0x0;
  execve("/bin/sh",prog,_environ);
  strerr_die(0x6f,"svlogd: fatal: ","unable to run processor",": ",ld->name,": ",(char *)0x0,
             &strerr_sys);
LAB_001039ba:
  ld->ppid = _Var1;
  return 1;
}

Assistant:

unsigned int processorstart(struct logdir *ld) {
  int pid;

  if (! ld->processor.len) return(0);
  if (ld->ppid) {
    warnx("processor already running", ld->name);
    return(0);
  }
  while ((pid =fork()) == -1)
    pause2("unable to fork for processor", ld->name);
  if (! pid) {
    char *prog[4];
    int fd;

    /* child */
    sig_uncatch(sig_term);
    sig_uncatch(sig_alarm);
    sig_uncatch(sig_hangup);
    sig_unblock(sig_term);
    sig_unblock(sig_alarm);
    sig_unblock(sig_hangup);

    if (verbose)
      strerr_warn5(INFO, "processing: ", ld->name, "/", ld->fnsave, 0);
    if ((fd =open_read(ld->fnsave)) == -1)
      fatal2("unable to open input for processor", ld->name);
    if (fd_move(0, fd) == -1)
      fatal2("unable to move filedescriptor for processor", ld->name);
    ld->fnsave[26] ='t';
    if ((fd =open_trunc(ld->fnsave)) == -1)
      fatal2("unable to open output for processor", ld->name);
    if (fd_move(1, fd) == -1)
      fatal2("unable to move filedescriptor for processor", ld->name);
    if ((fd =open_read("state")) == -1) {
      if (errno == error_noent) {
        if ((fd =open_trunc("state")) == -1)
          fatal2("unable to create empty state for processor", ld->name);
        close(fd);
        if ((fd =open_read("state")) == -1)
          fatal2("unable to open state for processor", ld->name);
      }
      else
        fatal2("unable to open state for processor", ld->name);
    }
    if (fd_move(4, fd) == -1)
      fatal2("unable to move filedescriptor for processor", ld->name);
    if ((fd =open_trunc("newstate")) == -1)
      fatal2("unable to open newstate for processor", ld->name);
    if (fd_move(5, fd) == -1)
      fatal2("unable to move filedescriptor for processor", ld->name);

    prog[0] = "sh";
    prog[1] = "-c";
    prog[2] = ld->processor.s;
    prog[3] = 0;
    execve("/bin/sh", prog, environ);
    fatal2("unable to run processor", ld->name);
  }
  ld->ppid =pid;
  return(1);
}